

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O3

bool __thiscall vera::Model::setGeom(Model *this,Mesh *_mesh)

{
  pointer *ppvVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  Material *pMVar6;
  undefined4 uVar7;
  Vbo *pVVar8;
  ulong uVar9;
  pointer pvVar10;
  long lVar11;
  float fVar12;
  float fVar15;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  string local_f8;
  Mesh local_d8;
  
  std::
  vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
  ::operator=(&(this->mesh).m_colors,&_mesh->m_colors);
  std::
  vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
  ::operator=(&(this->mesh).m_tangents,&_mesh->m_tangents);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::operator=(&(this->mesh).m_vertices,&_mesh->m_vertices);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::operator=(&(this->mesh).m_normals,&_mesh->m_normals);
  std::
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ::operator=(&(this->mesh).m_texCoords,&_mesh->m_texCoords);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (&(this->mesh).m_indices,&_mesh->m_indices);
  uVar7 = *(undefined4 *)&_mesh->field_0x9c;
  pMVar6 = _mesh->m_material;
  (this->mesh).m_drawMode = _mesh->m_drawMode;
  *(undefined4 *)&(this->mesh).field_0x9c = uVar7;
  (this->mesh).m_material = pMVar6;
  pVVar8 = (Vbo *)operator_new(0x60);
  Vbo::Vbo(pVVar8,_mesh);
  this->m_model_vbo = pVVar8;
  (this->m_bbox).min.field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x7f7fffff;
  (this->m_bbox).min.field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x7f7fffff;
  *(undefined8 *)&(this->m_bbox).min.field_2 = 0x8000007f7fffff;
  fVar12 = 1.1754944e-38;
  fVar15 = 1.1754944e-38;
  (this->m_bbox).max.field_1.y = 1.1754944e-38;
  (this->m_bbox).max.field_2.z = 1.1754944e-38;
  pvVar10 = (_mesh->m_vertices).
            super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((_mesh->m_vertices).
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_finish == pvVar10) {
    fVar16 = 1.1754944e-38;
    fVar17 = 3.4028235e+38;
    fVar18 = 0.0;
    fVar19 = 0.0;
    fVar3 = 3.4028235e+38;
    fVar4 = 3.4028235e+38;
  }
  else {
    lVar11 = 0;
    uVar9 = 0;
    do {
      BoundingBox::expand(&this->m_bbox,(vec3 *)((long)&pvVar10->field_0 + lVar11));
      uVar9 = uVar9 + 1;
      pvVar10 = (_mesh->m_vertices).
                super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar11 = lVar11 + 0xc;
    } while (uVar9 < (ulong)(((long)(_mesh->m_vertices).
                                    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar10 >> 2)
                            * -0x5555555555555555));
    fVar3 = *(float *)&(this->m_bbox).min.field_0;
    fVar4 = *(float *)&(this->m_bbox).min.field_1;
    fVar12 = (this->m_bbox).max.field_0.x;
    fVar15 = (this->m_bbox).max.field_1.y;
    fVar16 = (this->m_bbox).max.field_2.z;
    fVar18 = *(float *)((long)&(this->m_name)._M_dataplus._M_p + 4);
    fVar19 = *(float *)&(this->m_name)._M_string_length;
    fVar17 = (this->m_bbox).min.field_2.z;
  }
  auVar13._0_4_ = fVar12 * fVar12;
  auVar13._4_4_ = fVar15 * fVar15;
  auVar13._8_8_ = 0;
  auVar5._4_4_ = fVar4 * fVar4 + fVar3 * fVar3 + fVar17 * fVar17;
  auVar5._0_4_ = auVar13._4_4_ + auVar13._0_4_ + fVar16 * fVar16;
  auVar5._8_4_ = auVar13._4_4_ + 0.0 + fVar18 * fVar18;
  auVar5._12_4_ = fVar4 * fVar4 + 0.0 + fVar19 * fVar19;
  auVar14 = sqrtps(auVar13,auVar5);
  if (auVar14._4_4_ <= auVar14._0_4_) {
    auVar14._0_4_ = auVar14._4_4_;
  }
  this->m_area = auVar14._0_4_;
  pVVar8 = (Vbo *)operator_new(0x60);
  cubeCornersMesh(&local_d8,&this->m_bbox,0.25);
  Vbo::Vbo(pVVar8,&local_d8);
  this->m_bbox_vbo = pVVar8;
  Mesh::~Mesh(&local_d8);
  if ((_mesh->m_colors).
      super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (_mesh->m_colors).
      super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ppvVar1 = &local_d8.m_colors.
               super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    local_d8._vptr_Mesh = (_func_int **)ppvVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"MODEL_VERTEX_COLOR","");
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"v_color","");
    addDefine(this,(string *)&local_d8,&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
    if ((pointer *)local_d8._vptr_Mesh != ppvVar1) {
      operator_delete(local_d8._vptr_Mesh);
    }
  }
  if ((_mesh->m_normals).
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (_mesh->m_normals).
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ppvVar1 = &local_d8.m_colors.
               super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    local_d8._vptr_Mesh = (_func_int **)ppvVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"MODEL_VERTEX_NORMAL","");
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"v_normal","");
    addDefine(this,(string *)&local_d8,&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
    if ((pointer *)local_d8._vptr_Mesh != ppvVar1) {
      operator_delete(local_d8._vptr_Mesh);
    }
  }
  if ((_mesh->m_texCoords).
      super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (_mesh->m_texCoords).
      super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ppvVar1 = &local_d8.m_colors.
               super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    local_d8._vptr_Mesh = (_func_int **)ppvVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"MODEL_VERTEX_TEXCOORD","");
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"v_texcoord","");
    addDefine(this,(string *)&local_d8,&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
    if ((pointer *)local_d8._vptr_Mesh != ppvVar1) {
      operator_delete(local_d8._vptr_Mesh);
    }
  }
  if ((_mesh->m_tangents).
      super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (_mesh->m_tangents).
      super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ppvVar1 = &local_d8.m_colors.
               super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    local_d8._vptr_Mesh = (_func_int **)ppvVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"MODEL_VERTEX_TANGENT","");
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"v_tangent","");
    addDefine(this,(string *)&local_d8,&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
    if ((pointer *)local_d8._vptr_Mesh != ppvVar1) {
      operator_delete(local_d8._vptr_Mesh);
    }
  }
  switch(_mesh->m_drawMode) {
  case POINTS:
    local_d8._vptr_Mesh =
         (_func_int **)
         &local_d8.m_colors.
          super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
          ._M_impl.super__Vector_impl_data._M_finish;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"MODEL_PRIMITIVE_POINTS","")
    ;
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
    addDefine(this,(string *)&local_d8,&local_f8);
    break;
  case LINES:
    local_d8._vptr_Mesh =
         (_func_int **)
         &local_d8.m_colors.
          super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
          ._M_impl.super__Vector_impl_data._M_finish;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"MODEL_PRIMITIVE_LINES","");
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
    addDefine(this,(string *)&local_d8,&local_f8);
    break;
  case LINE_STRIP:
    local_d8._vptr_Mesh =
         (_func_int **)
         &local_d8.m_colors.
          super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
          ._M_impl.super__Vector_impl_data._M_finish;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,"MODEL_PRIMITIVE_LINE_STRIP","");
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
    addDefine(this,(string *)&local_d8,&local_f8);
    break;
  case LINE_LOOP:
    local_d8._vptr_Mesh =
         (_func_int **)
         &local_d8.m_colors.
          super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
          ._M_impl.super__Vector_impl_data._M_finish;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,"MODEL_PRIMITIVE_LINE_LOOP","");
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
    addDefine(this,(string *)&local_d8,&local_f8);
    break;
  case TRIANGLES:
    local_d8._vptr_Mesh =
         (_func_int **)
         &local_d8.m_colors.
          super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
          ._M_impl.super__Vector_impl_data._M_finish;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,"MODEL_PRIMITIVE_TRIANGLES","");
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
    addDefine(this,(string *)&local_d8,&local_f8);
    break;
  default:
    goto switchD_0023ab8c_caseD_5;
  case TRIANGLE_FAN:
    local_d8._vptr_Mesh =
         (_func_int **)
         &local_d8.m_colors.
          super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
          ._M_impl.super__Vector_impl_data._M_finish;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,"MODEL_PRIMITIVE_TRIANGLE_FAN","");
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
    addDefine(this,(string *)&local_d8,&local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  if ((pointer *)local_d8._vptr_Mesh !=
      &local_d8.m_colors.
       super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) {
    operator_delete(local_d8._vptr_Mesh);
  }
switchD_0023ab8c_caseD_5:
  ppvVar1 = &local_d8.m_colors.
             super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_d8._vptr_Mesh = (_func_int **)ppvVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"LIGHT_SHADOWMAP","");
  paVar2 = &local_f8.field_2;
  local_f8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"u_lightShadowMap","");
  addDefine(this,(string *)&local_d8,&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  if ((pointer *)local_d8._vptr_Mesh != ppvVar1) {
    operator_delete(local_d8._vptr_Mesh);
  }
  local_d8._vptr_Mesh = (_func_int **)ppvVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"LIGHT_SHADOWMAP_SIZE","");
  local_f8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"2048.0","");
  addDefine(this,(string *)&local_d8,&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  if ((pointer *)local_d8._vptr_Mesh != ppvVar1) {
    operator_delete(local_d8._vptr_Mesh);
  }
  return true;
}

Assistant:

bool Model::setGeom(const Mesh& _mesh) {
    mesh = _mesh;

    // Load Geometry VBO
    m_model_vbo = new Vbo(_mesh);

    m_bbox.clean();
    for (size_t i = 0; i < _mesh.getVerticesTotal(); i++)
        m_bbox.expand( _mesh.getVertex(i) );

    m_area = glm::min(glm::length(m_bbox.min), glm::length(m_bbox.max));
    m_bbox_vbo = new Vbo( cubeCornersMesh( m_bbox, 0.25 ) );

    // Setup Shader and GEOMETRY DEFINE FLAGS
    if (_mesh.haveColors())
        addDefine("MODEL_VERTEX_COLOR", "v_color");

    if (_mesh.haveNormals())
        addDefine("MODEL_VERTEX_NORMAL", "v_normal");

    if (_mesh.haveTexCoords())
        addDefine("MODEL_VERTEX_TEXCOORD", "v_texcoord");

    if (_mesh.haveTangents())
        addDefine("MODEL_VERTEX_TANGENT", "v_tangent");

    if (_mesh.getDrawMode() == POINTS)
        addDefine("MODEL_PRIMITIVE_POINTS");
    else if (_mesh.getDrawMode() == LINES)
        addDefine("MODEL_PRIMITIVE_LINES");
    else if (_mesh.getDrawMode() == LINE_LOOP)
        addDefine("MODEL_PRIMITIVE_LINE_LOOP");
    else if (_mesh.getDrawMode() == LINE_STRIP)
        addDefine("MODEL_PRIMITIVE_LINE_STRIP");
    else if (_mesh.getDrawMode() == TRIANGLES)
        addDefine("MODEL_PRIMITIVE_TRIANGLES");
    else if (_mesh.getDrawMode() == TRIANGLE_FAN)
        addDefine("MODEL_PRIMITIVE_TRIANGLE_FAN");

    addDefine("LIGHT_SHADOWMAP", "u_lightShadowMap");
    addDefine("LIGHT_SHADOWMAP_SIZE", "2048.0");

    return true;
}